

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::operator*(mat3 *__return_storage_ptr__,mat3 *a,mat3 *b)

{
  vec3 *pvVar1;
  vec3 *b_00;
  float_t *pfVar2;
  float_t fVar3;
  int local_44;
  int local_40;
  int i;
  int j;
  mat3 t;
  mat3 *b_local;
  mat3 *a_local;
  
  t.m[2]._4_8_ = b;
  transpose((mat3 *)&i,b);
  mat3::mat3(__return_storage_ptr__,1.0);
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      pvVar1 = mat3::operator[](a,local_40);
      b_00 = mat3::operator[]((mat3 *)&i,local_44);
      fVar3 = dot(pvVar1,b_00);
      pvVar1 = mat3::operator[](__return_storage_ptr__,local_40);
      pfVar2 = vec3::operator[](pvVar1,local_44);
      *pfVar2 = fVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const mat3& a, const mat3& b)
{
    mat3 t = transpose(b), r;

    for (int j = 0; j < 3; ++j)
    for (int i = 0; i < 3; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}